

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAxyzDD::ChNodeFEAxyzDD
          (ChNodeFEAxyzDD *this,ChVector<double> *initial_pos,ChVector<double> *initial_dir,
          ChVector<double> *initial_curv)

{
  double dVar1;
  long lVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  ChVariablesGenericDiagonalMass *this_00;
  undefined1 auVar5 [16];
  ChVector<double> local_58;
  ChVector<double> local_38;
  undefined1 auVar6 [32];
  
  ChNodeBase::ChNodeBase((ChNodeBase *)&this->field_0x188);
  *(undefined ***)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase.field_0x18 =
       &PTR__ChLoadable_00b04a88;
  local_38.m_data[0] = initial_pos->m_data[0];
  local_38.m_data[1] = initial_pos->m_data[1];
  local_38.m_data[2] = initial_pos->m_data[2];
  local_58.m_data[0] = initial_dir->m_data[0];
  local_58.m_data[1] = initial_dir->m_data[1];
  local_58.m_data[2] = initial_dir->m_data[2];
  ChNodeFEAxyzD::ChNodeFEAxyzD
            (&this->super_ChNodeFEAxyzD,&PTR_construction_vtable_32__00b2e7e0,&local_38,&local_58);
  (this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase._vptr_ChNodeFEAbase =
       (_func_int **)0xb2e388;
  *(undefined8 *)&this->field_0x188 = 0xb2e720;
  *(undefined8 *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase.field_0x18 =
       0xb2e580;
  (this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChVariableTupleCarrier_1vars<3>.
  _vptr_ChVariableTupleCarrier_1vars = (_func_int **)(vtable + 0x2e0);
  *(double *)&(this->super_ChNodeFEAxyzD).field_0x140 = initial_curv->m_data[0];
  *(double *)&this->field_0x148 = initial_curv->m_data[1];
  auVar4 = _VNULL;
  auVar5._8_8_ = DAT_00b689a8;
  auVar5._0_8_ = DAT_00b689a8;
  auVar6._16_8_ = DAT_00b689a8;
  auVar6._0_16_ = auVar5;
  auVar6._24_8_ = DAT_00b689a8;
  auVar3 = vpermpd_avx2(ZEXT1632(_VNULL),0xd0);
  auVar3 = vblendps_avx(auVar3,ZEXT832((ulong)initial_curv->m_data[2]),3);
  auVar3 = vblendps_avx(auVar3,auVar6,0xc0);
  *(undefined1 (*) [32])&this->field_0x150 = auVar3;
  *(undefined1 (*) [16])(this->DD_dtdt).m_data = auVar4;
  dVar1 = (double)vmovlps_avx(auVar5);
  (this->DD_dtdt).m_data[2] = dVar1;
  this_00 = (ChVariablesGenericDiagonalMass *)::operator_new(0x50);
  ChVariablesGenericDiagonalMass::ChVariablesGenericDiagonalMass(this_00,3);
  *(ChVariablesGenericDiagonalMass **)&(this->super_ChNodeFEAxyzD).field_0x138 = this_00;
  lVar2 = (this_00->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows;
  if (-1 < lVar2) {
    if (lVar2 != 0) {
      memset((this_00->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data,0,lVar2 << 3);
    }
    return;
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

ChNodeFEAxyzDD::ChNodeFEAxyzDD(ChVector<> initial_pos, ChVector<> initial_dir, ChVector<> initial_curv)
    : ChNodeFEAxyzD(initial_pos, initial_dir), DD(initial_curv), DD_dt(VNULL), DD_dtdt(VNULL) {
    variables_DD = new ChVariablesGenericDiagonalMass(3);
    // default: no atomic mass associated to fea node, the fea element will add mass matrix
    variables_DD->GetMassDiagonal().setZero();
}